

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testlab3-0.c
# Opt level: O0

int checkerBig(void)

{
  int iVar1;
  char *pcVar2;
  uint local_28;
  uint local_24;
  int n;
  int last;
  int passed;
  int i;
  FILE *out;
  
  _passed = fopen("out.txt","r");
  n = 1;
  local_24 = 0;
  if (_passed == (FILE *)0x0) {
    printf("can\'t open out.txt\n");
    testN = testN + 1;
    out._4_4_ = -1;
  }
  else {
    for (last = 0; last < 2000000; last = last + 1) {
      pcVar2 = ScanInt((FILE *)_passed,(int *)&local_28);
      if (pcVar2 != "PASSED") {
        n = 0;
        break;
      }
      if (((int)(local_28 ^ 0x1234567) < 0) || (1999999 < (int)(local_28 ^ 0x1234567))) {
        n = 0;
        printf("wrong output -- ");
        break;
      }
      if (last == 0) {
        local_24 = local_28;
      }
      else if ((int)local_28 <= (int)local_24) {
        n = 0;
        printf("wrong output -- ");
        break;
      }
    }
    if (n != 0) {
      iVar1 = HaveGarbageAtTheEnd((FILE *)_passed);
      n = (int)((iVar1 != 0 ^ 0xffU) & 1);
    }
    fclose(_passed);
    if (n == 0) {
      printf("FAILED\n");
      testN = testN + 1;
      out._4_4_ = 1;
    }
    else {
      printf("PASSED\n");
      testN = testN + 1;
      out._4_4_ = 0;
    }
  }
  return out._4_4_;
}

Assistant:

static int checkerBig(void)
{
    FILE *const out = fopen("out.txt", "r");
    int i, passed = 1, last = 0;
    if (!out) {
        printf("can't open out.txt\n");
        testN++;
        return -1;
    }
    for (i = 0; i < 2000000; i++) {
        int n;
        if (ScanInt(out, &n) != Pass) {
            passed = 0;
            break;
        } else if ((n^0x1234567) < 0 || 2000000 <= (n^0x1234567)) {
            passed = 0;
            printf("wrong output -- ");
            break;
        } else if (i == 0) {
            last = n;
            continue;
        } else if (n <= last ) {
            passed = 0;
            printf("wrong output -- ");
            break;
        }
    }
    if (passed) {
        passed = !HaveGarbageAtTheEnd(out);
    }
    fclose(out);
    if (passed) {
        printf("PASSED\n");
        testN++;
        return 0;
    } else {
        printf("FAILED\n");
        testN++;
        return 1;
    }
}